

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void __thiscall llvm::APInt::print(APInt *this,raw_ostream *OS,bool isSigned)

{
  undefined1 local_58 [8];
  SmallString<40U> S;
  bool isSigned_local;
  raw_ostream *OS_local;
  APInt *this_local;
  
  S.super_SmallVector<char,_40U>.super_SmallVectorStorage<char,_40U>.InlineElts[0x27].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] =
       (AlignedCharArray<1UL,_1UL>)(AlignedCharArray<1UL,_1UL>)isSigned;
  SmallString<40U>::SmallString((SmallString<40U> *)local_58);
  toString(this,(SmallVectorImpl<char> *)local_58,10,
           (bool)((byte)S.super_SmallVector<char,_40U>.super_SmallVectorStorage<char,_40U>.
                        InlineElts[0x27].super_AlignedCharArray<1UL,_1UL>.buffer[0] & 1),false);
  raw_ostream::operator<<(OS,(SmallVectorImpl<char> *)local_58);
  SmallString<40U>::~SmallString((SmallString<40U> *)local_58);
  return;
}

Assistant:

void APInt::print(raw_ostream &OS, bool isSigned) const {
  SmallString<40> S;
  this->toString(S, 10, isSigned, /* formatAsCLiteral = */false);
  OS << S;
}